

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_headers.c
# Opt level: O1

int test_ushort(void)

{
  puts("\nVerifying assignment:");
  printf("b:   %d\n",0);
  printf("b2:  %d %d \n",0,1);
  printf("b4:  %d %d %d %d\n",0,1,2,3);
  printf("b8:  %d %d %d %d %d %d %d %d\n",0,1,2,3,4,5,6,7);
  printf("b16: %d %d %d %d %d %d %d %d %d %d %d %d %d %d %d %d\n",0,1,2,3,4,5,6,7,8,9,10,0xb,0xc,0xd
         ,0xe,0xf);
  puts("\nVerifying vector access:");
  puts("__cl_ushort2 SIMD vectors not supported on this architecture.");
  printf("__cl_ushort4:  %d %d %d %d \n",0,1,2,3);
  printf("__cl_ushort8:  %d %d %d %d %d %d %d %d \n",0,1,2,3,4,5,6,7);
  puts("__cl_ushort16 SIMD vectors not supported on this architecture.");
  putchar(10);
  return 0;
}

Assistant:

int test_ushort(void)
{
/* ushort */
    /* Constructor */
    cl_ushort a = 0;
    cl_ushort2 a2 = {{ 0, 1 }};
    cl_ushort4 a4 = {{ 0, 1, 2, 3 }};
    cl_ushort8 a8 = {{ 0, 1, 2, 3, 4, 5, 6, 7 }};
    cl_ushort16 a16 = {{ 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 }};

    /* assignment */
    cl_ushort    b = a;
    cl_ushort2   b2 = a2;
    cl_ushort4   b4 = a4;
    cl_ushort8   b8 = a8;
    cl_ushort16  b16 = a16;

    printf("\nVerifying assignment:\n" );
    printf("b:   %d\n", b );
    printf("b2:  %d %d \n", b2.s[0], b2.s[1] );
    printf("b4:  %d %d %d %d\n", b4.s[0], b4.s[1], b4.s[2], b4.s[3] );
    printf("b8:  %d %d %d %d %d %d %d %d\n", b8.s[0], b8.s[1], b8.s[2], b8.s[3], b8.s[4], b8.s[5], b8.s[6], b8.s[7] );
    printf("b16: %d %d %d %d %d %d %d %d %d %d %d %d %d %d %d %d\n", b16.s[0], b16.s[1], b16.s[2], b16.s[3], b16.s[4], b16.s[5], b16.s[6], b16.s[7],
                                                                     b16.s[8], b16.s[9], b16.s[10], b16.s[11], b16.s[12], b16.s[13], b16.s[14], b16.s[15]);

    /* vector access */
    printf("\nVerifying vector access:\n" );
#if defined( __CL_USHORT2__ )
    __cl_ushort2 v2 = b2.v2;
    printf("__cl_ushort2:  %d %d \n", ((unsigned short*)&v2)[0], ((unsigned short*)&v2)[1] );
#else
    printf( "__cl_ushort2 SIMD vectors not supported on this architecture.\n" );
#endif

#if defined( __CL_USHORT4__ )
    __cl_ushort4 v4 = b4.v4;
    printf("__cl_ushort4:  %d %d %d %d \n", ((unsigned short*)&v4)[0], ((unsigned short*)&v4)[1], ((unsigned short*)&v4)[2], ((unsigned short*)&v4)[3] );
#else
    printf( "__cl_ushort4 SIMD vectors not supported on this architecture.\n" );
#endif

#if defined( __CL_USHORT8__ )
    __cl_ushort8 v8 = b8.v8;
    printf("__cl_ushort8:  %d %d %d %d %d %d %d %d \n", ((unsigned short*)&v8)[0], ((unsigned short*)&v8)[1], ((unsigned short*)&v8)[2], ((unsigned short*)&v8)[3], ((unsigned short*)&v8)[4], ((unsigned short*)&v8)[5], ((unsigned short*)&v8)[6], ((unsigned short*)&v8)[7] );
#else
    printf( "__cl_ushort8 SIMD vectors not supported on this architecture.\n" );
#endif

#if defined( __CL_USHORT16__ )
    __cl_ushort16 v16 = b16.v16;
    printf("__cl_ushort16: %d %d %d %d %d %d %d %d %d %d %d %d %d %d %d %d \n", ((unsigned short*)&v16)[0], ((unsigned short*)&v16)[1], ((unsigned short*)&v16)[2], ((unsigned short*)&v16)[3], ((unsigned short*)&v16)[4], ((unsigned short*)&v16)[5], ((unsigned short*)&v16)[6], ((unsigned short*)&v16)[7],
                                                                      ((unsigned short*)&v16)[8], ((unsigned short*)&v16)[9], ((unsigned short*)&v16)[10], ((unsigned short*)&v16)[11], ((unsigned short*)&v16)[12], ((unsigned short*)&v16)[13], ((unsigned short*)&v16)[14], ((unsigned short*)&v16)[15]);
#else
    printf( "__cl_ushort16 SIMD vectors not supported on this architecture.\n" );
#endif

    printf( "\n" );
    return 0;
}